

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_resolver_results.hpp
# Opt level: O1

basic_resolver_results<asio::ip::tcp> *
asio::ip::basic_resolver_results<asio::ip::tcp>::create
          (basic_resolver_results<asio::ip::tcp> *__return_storage_ptr__,addrinfo_type *address_info
          ,string *host_name,string *service_name)

{
  pointer pcVar1;
  char *__s;
  vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>>>
  *this;
  size_type __len1;
  size_t __len2;
  vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>
  *__p;
  string_view host;
  string_view service;
  string actual_host_name;
  endpoint endpoint;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  data_union local_b8;
  basic_resolver_entry<asio::ip::tcp> local_90;
  
  (__return_storage_ptr__->super_basic_resolver_iterator<asio::ip::tcp>).values_.
  super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->super_basic_resolver_iterator<asio::ip::tcp>).values_.
  super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->super_basic_resolver_iterator<asio::ip::tcp>).index_ = 0;
  if (address_info != (addrinfo_type *)0x0) {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    pcVar1 = (host_name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,pcVar1,pcVar1 + host_name->_M_string_length);
    __len1 = local_d8._M_string_length;
    __s = address_info->ai_canonname;
    if (__s != (char *)0x0) {
      __len2 = strlen(__s);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (&local_d8,0,__len1,__s,__len2);
    }
    __p = (vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>
           *)operator_new(0x18);
    (__p->
    super__Vector_base<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__p->
    super__Vector_base<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__p->
    super__Vector_base<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    __shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>>>,(__gnu_cxx::_Lock_policy)2>
    ::
    reset<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>>>>
              ((__shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>>>,(__gnu_cxx::_Lock_policy)2>
                *)__return_storage_ptr__,__p);
    do {
      if ((address_info->ai_family | 8U) == 10) {
        local_b8._8_4_ = 0;
        local_b8._12_4_ = 0;
        local_b8._16_4_ = 0;
        local_b8._20_8_ = 0;
        local_b8._0_8_ = 2;
        basic_endpoint<asio::ip::tcp>::resize
                  ((basic_endpoint<asio::ip::tcp> *)&local_b8.base,(ulong)address_info->ai_addrlen);
        memcpy(&local_b8,address_info->ai_addr,(ulong)address_info->ai_addrlen);
        this = (vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>>>
                *)(__return_storage_ptr__->super_basic_resolver_iterator<asio::ip::tcp>).values_.
                  super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        host._M_str = local_d8._M_dataplus._M_p;
        host._M_len = local_d8._M_string_length;
        service._M_str = (service_name->_M_dataplus)._M_p;
        service._M_len = service_name->_M_string_length;
        basic_resolver_entry<asio::ip::tcp>::basic_resolver_entry
                  (&local_90,(endpoint_type *)&local_b8.base,host,service);
        std::
        vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>>>
        ::emplace_back<asio::ip::basic_resolver_entry<asio::ip::tcp>>(this,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90.service_name_._M_dataplus._M_p != &local_90.service_name_.field_2) {
          operator_delete(local_90.service_name_._M_dataplus._M_p,
                          local_90.service_name_.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90.host_name_._M_dataplus._M_p != &local_90.host_name_.field_2) {
          operator_delete(local_90.host_name_._M_dataplus._M_p,
                          local_90.host_name_.field_2._M_allocated_capacity + 1);
        }
      }
      address_info = address_info->ai_next;
    } while (address_info != (addrinfo *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static basic_resolver_results create(
      asio::detail::addrinfo_type* address_info,
      const std::string& host_name, const std::string& service_name)
  {
    basic_resolver_results results;
    if (!address_info)
      return results;

    std::string actual_host_name = host_name;
    if (address_info->ai_canonname)
      actual_host_name = address_info->ai_canonname;

    results.values_.reset(new values_type);

    while (address_info)
    {
      if (address_info->ai_family == ASIO_OS_DEF(AF_INET)
          || address_info->ai_family == ASIO_OS_DEF(AF_INET6))
      {
        using namespace std; // For memcpy.
        typename InternetProtocol::endpoint endpoint;
        endpoint.resize(static_cast<std::size_t>(address_info->ai_addrlen));
        memcpy(endpoint.data(), address_info->ai_addr,
            address_info->ai_addrlen);
        results.values_->push_back(
            basic_resolver_entry<InternetProtocol>(endpoint,
              actual_host_name, service_name));
      }
      address_info = address_info->ai_next;
    }

    return results;
  }